

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_gcd.c
# Opt level: O0

bool_t zzIsCoprime(word *a,size_t n,word *b,size_t m,void *stack)

{
  bool_t bVar1;
  ulong in_RCX;
  word *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  word *in_R8;
  void *in_stack_00000018;
  word *d;
  size_t local_58;
  bool_t local_4;
  
  bVar1 = wwIsZero(in_RDI,in_RSI);
  if (bVar1 == 0) {
    bVar1 = wwIsZero(in_RDX,in_RCX);
    if (bVar1 == 0) {
      zzGCD((word *)n,b,m,(word *)stack,(size_t)d,in_stack_00000018);
      local_58 = in_RCX;
      if (in_RSI < in_RCX) {
        local_58 = in_RSI;
      }
      local_4 = wwIsW(in_R8,local_58,1);
    }
    else {
      local_4 = wwIsW(in_RDI,in_RSI,1);
    }
  }
  else {
    local_4 = wwIsW(in_RDX,in_RCX,1);
  }
  return local_4;
}

Assistant:

bool_t zzIsCoprime(const word a[], size_t n, const word b[], size_t m, void* stack)
{
	word* d = (word*)stack;
	stack = d + MIN2(n, m);
	// a == 0 => (a, b) = b
	if (wwIsZero(a, n))
		return wwIsW(b, m, 1);
	// b == 0 => (a, b) = a
	if (wwIsZero(b, m))
		return wwIsW(a, n, 1);
	// d <- (a, b), d == 1?
	zzGCD(d, a, n, b, m, stack);
	return wwIsW(d, MIN2(n, m), 1);
}